

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::RunContext::runCurrentTest(RunContext *this,string *redirectedCout,string *redirectedCerr)

{
  bool bVar1;
  IEventListener *pIVar2;
  SectionInfo *_sectionInfo;
  RedirectedStreams *in_RDI;
  SectionStats testCaseSectionStats;
  bool missingAssertions;
  Counts assertions;
  TestFailureException *anon_var_0;
  TestSkipException *anon_var_0_1;
  AssertionReaction dummyReaction;
  RedirectedStreams redirectedStreams;
  Timer timer;
  double duration;
  Counts prevAssertions;
  SectionInfo testCaseSection;
  TestCaseInfo *testCaseInfo;
  size_t in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  char *in_stack_fffffffffffffda8;
  RunContext *this_00;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffdb4;
  SourceLineInfo *in_stack_fffffffffffffdb8;
  undefined1 local_228 [8];
  RedirectedStreams *in_stack_fffffffffffffde0;
  undefined1 local_1c0 [224];
  streambuf *psStack_e0;
  ostream *local_d8;
  ostream *poStack_d0;
  StringRef local_c8;
  undefined4 local_b8;
  pointer local_b0;
  pointer local_a8;
  pointer pMStack_a0;
  pointer local_98;
  pointer pSStack_90;
  string local_70 [32];
  undefined1 local_50 [48];
  TestCaseInfo *local_20;
  
  local_20 = TestCaseHandle::getTestCaseInfo
                       (*(TestCaseHandle **)((long)&in_RDI->m_redirectedStdOut + 8));
  std::__cxx11::string::string(local_70,(string *)local_20);
  SectionInfo::SectionInfo
            ((SectionInfo *)in_RDI,in_stack_fffffffffffffdb8,
             (string *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
             in_stack_fffffffffffffda8);
  std::__cxx11::string::~string(local_70);
  pIVar2 = Detail::unique_ptr<Catch::IEventListener>::operator->
                     ((unique_ptr<Catch::IEventListener> *)((long)&in_RDI[2].m_redirectedStdOut + 8)
                     );
  (*pIVar2->_vptr_IEventListener[7])(pIVar2,local_50);
  local_a8 = (pointer)in_RDI[1].m_redirectedStdErr.m_cerr.m_redirectionStream;
  pMStack_a0 = (pointer)in_RDI[1].m_redirectedStdErr.m_cerr.m_prevBuf;
  local_98 = (pointer)in_RDI[1].m_redirectedStdErr.m_clog.m_originalStream;
  pSStack_90 = (pointer)in_RDI[1].m_redirectedStdErr.m_clog.m_redirectionStream;
  local_b0 = (pointer)0x0;
  *(undefined1 *)((long)&in_RDI[3].m_redirectedStdErr.m_cerr.m_prevBuf + 2) = 1;
  join_0x00000010_0x00000000_ =
       operator____sr((char *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                      in_stack_fffffffffffffd98);
  local_d8 = (ostream *)(local_20->lineInfo).file;
  poStack_d0 = (ostream *)(local_20->lineInfo).line;
  local_c8.m_start = (char *)0x0;
  local_c8.m_size = 0;
  StringRef::StringRef(&local_c8);
  local_b8 = 1;
  *(undefined4 *)&in_RDI[3].m_redirectedCerr = 1;
  in_RDI[2].m_redirectedStdErr.m_clog.m_prevBuf = (streambuf *)local_c8.m_start;
  in_RDI[3].m_redirectedCout = (string *)local_c8.m_size;
  in_RDI[2].m_redirectedStdErr.m_clog.m_originalStream = local_d8;
  in_RDI[2].m_redirectedStdErr.m_clog.m_redirectionStream = poStack_d0;
  in_RDI[2].m_redirectedStdErr.m_cerr.m_redirectionStream = (ostream *)local_1c0._216_8_;
  in_RDI[2].m_redirectedStdErr.m_cerr.m_prevBuf = psStack_e0;
  Timer::Timer((Timer *)(local_1c0 + 0xd0));
  pIVar2 = Detail::unique_ptr<Catch::IEventListener>::operator->
                     ((unique_ptr<Catch::IEventListener> *)((long)&in_RDI[2].m_redirectedStdOut + 8)
                     );
  _sectionInfo = (SectionInfo *)IEventListener::getPreferences(pIVar2);
  if (((byte)(_sectionInfo->name)._M_dataplus & 1) == 0) {
    Timer::start((Timer *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    invokeActiveTestCase
              ((RunContext *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  }
  else {
    RedirectedStreams::RedirectedStreams
              (in_RDI,(string *)_sectionInfo,
               (string *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    Timer::start((Timer *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    invokeActiveTestCase
              ((RunContext *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
    RedirectedStreams::~RedirectedStreams(in_stack_fffffffffffffde0);
  }
  local_b0 = (pointer)Timer::getElapsedSeconds((Timer *)0x18fb85);
  this_00 = (RunContext *)local_1c0;
  Counts::operator-((Counts *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                    (Counts *)this_00);
  bVar1 = testForMissingAssertions
                    (this_00,(Counts *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0)
                    );
  uVar3 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdb0);
  (**(code **)(*(long *)(in_RDI->m_redirectedStdOut).m_cout.m_originalStream + 0x18))();
  handleUnfinishedSections((RunContext *)CONCAT44(in_stack_fffffffffffffdb4,uVar3));
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)0x18fa2e);
  std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::clear
            ((vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_> *)0x18fa3f);
  SectionStats::SectionStats
            ((SectionStats *)in_RDI,_sectionInfo,(Counts *)CONCAT44(in_stack_fffffffffffffdb4,uVar3)
             ,(double)this_00,(bool)in_stack_fffffffffffffda7);
  pIVar2 = Detail::unique_ptr<Catch::IEventListener>::operator->
                     ((unique_ptr<Catch::IEventListener> *)&in_RDI[2].m_redirectedStdOut.m_rss.m_oss
                     );
  (*pIVar2->_vptr_IEventListener[0xe])(pIVar2,local_228);
  SectionStats::~SectionStats((SectionStats *)0x18fa9d);
  SectionInfo::~SectionInfo((SectionInfo *)0x18faaa);
  return;
}

Assistant:

void RunContext::runCurrentTest(std::string & redirectedCout, std::string & redirectedCerr) {
        auto const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
        SectionInfo testCaseSection(testCaseInfo.lineInfo, testCaseInfo.name);
        m_reporter->sectionStarting(testCaseSection);
        Counts prevAssertions = m_totals.assertions;
        double duration = 0;
        m_shouldReportUnexpected = true;
        m_lastAssertionInfo = { "TEST_CASE"_sr, testCaseInfo.lineInfo, StringRef(), ResultDisposition::Normal };

        Timer timer;
        CATCH_TRY {
            if (m_reporter->getPreferences().shouldRedirectStdOut) {
#if !defined(CATCH_CONFIG_EXPERIMENTAL_REDIRECT)
                RedirectedStreams redirectedStreams(redirectedCout, redirectedCerr);

                timer.start();
                invokeActiveTestCase();
#else
                OutputRedirect r(redirectedCout, redirectedCerr);
                timer.start();
                invokeActiveTestCase();
#endif
            }